

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::AggressiveDCEPass::ProcessImpl(AggressiveDCEPass *this)

{
  Instruction *inst_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  IRContext *pIVar4;
  FeatureManager *pFVar5;
  Module *pMVar6;
  reference ppIVar7;
  reference pvVar8;
  Function *fp_1;
  iterator __end2_2;
  iterator __begin2_2;
  Module *__range2_2;
  Instruction *inst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  Function *fp;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  bool modified;
  AggressiveDCEPass *this_local;
  
  pIVar4 = Pass::context((Pass *)this);
  pFVar5 = IRContext::get_feature_mgr(pIVar4);
  bVar1 = FeatureManager::HasCapability(pFVar5,CapabilityShader);
  if (bVar1) {
    pIVar4 = Pass::context((Pass *)this);
    pFVar5 = IRContext::get_feature_mgr(pIVar4);
    bVar1 = FeatureManager::HasCapability(pFVar5,Addresses);
    if (bVar1) {
      this_local._4_4_ = SuccessWithoutChange;
    }
    else {
      pIVar4 = Pass::context((Pass *)this);
      pFVar5 = IRContext::get_feature_mgr(pIVar4);
      bVar1 = FeatureManager::HasCapability(pFVar5,CapabilityVariablePointersStorageBuffer);
      if (bVar1) {
        this_local._4_4_ = SuccessWithoutChange;
      }
      else {
        bVar1 = AllExtensionsSupported(this);
        if (bVar1) {
          __range2._7_1_ = EliminateDeadFunctions(this);
          InitializeModuleScopeLiveInstructions(this);
          pIVar4 = Pass::context((Pass *)this);
          pMVar6 = IRContext::module(pIVar4);
          join_0x00000010_0x00000000_ = Module::begin(pMVar6);
          _fp = Module::end(pMVar6);
          while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                                   ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                    &__end2.iterator_,
                                    (UptrVectorIterator<spvtools::opt::Function,_false> *)&fp),
                bVar1) {
            pvVar8 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                               ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                &__end2.iterator_);
            bVar1 = AggressiveDCE(this,pvVar8);
            __range2._7_1_ = __range2._7_1_ != false || bVar1;
            UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
          }
          pIVar4 = Pass::context((Pass *)this);
          IRContext::InvalidateAnalyses(pIVar4,kAnalysisDecorations);
          bVar2 = ProcessGlobalValues(this);
          bVar1 = __range2._7_1_ != false || bVar2;
          bVar3 = std::
                  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ::empty(&this->to_kill_);
          if ((bVar3) || (bVar3 = false, __range2._7_1_ != false || bVar2)) {
            bVar3 = true;
          }
          if (!bVar3) {
            __assert_fail("(to_kill_.empty() || modified) && \"A dead instruction was identified, but no change recorded.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                          ,0x2e2,"Pass::Status spvtools::opt::AggressiveDCEPass::ProcessImpl()");
          }
          __end2_1 = std::
                     vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ::begin(&this->to_kill_);
          inst = (Instruction *)
                 std::
                 vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ::end(&this->to_kill_);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                     *)&inst), bVar2) {
            ppIVar7 = __gnu_cxx::
                      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                      ::operator*(&__end2_1);
            inst_00 = *ppIVar7;
            pIVar4 = Pass::context((Pass *)this);
            IRContext::KillInst(pIVar4,inst_00);
            __gnu_cxx::
            __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::operator++(&__end2_1);
          }
          pIVar4 = Pass::context((Pass *)this);
          pMVar6 = IRContext::module(pIVar4);
          join_0x00000010_0x00000000_ = Module::begin(pMVar6);
          _fp_1 = Module::end(pMVar6);
          while (bVar2 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                                   ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                    &__end2_2.iterator_,
                                    (UptrVectorIterator<spvtools::opt::Function,_false> *)&fp_1),
                bVar2) {
            pvVar8 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                               ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                &__end2_2.iterator_);
            bVar2 = MemPass::CFGCleanup(&this->super_MemPass,pvVar8);
            bVar1 = bVar1 || bVar2;
            UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                      ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2_2.iterator_);
          }
          this_local._4_4_ = SuccessWithoutChange;
          if (bVar1) {
            this_local._4_4_ = SuccessWithChange;
          }
        }
        else {
          this_local._4_4_ = SuccessWithoutChange;
        }
      }
    }
  }
  else {
    this_local._4_4_ = SuccessWithoutChange;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status AggressiveDCEPass::ProcessImpl() {
  // Current functionality assumes shader capability
  // TODO(greg-lunarg): Handle additional capabilities
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return Status::SuccessWithoutChange;

  // Current functionality assumes relaxed logical addressing (see
  // instruction.h)
  // TODO(greg-lunarg): Handle non-logical addressing
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Addresses))
    return Status::SuccessWithoutChange;

  // The variable pointer extension is no longer needed to use the capability,
  // so we have to look for the capability.
  if (context()->get_feature_mgr()->HasCapability(
          spv::Capability::VariablePointersStorageBuffer))
    return Status::SuccessWithoutChange;

  // If any extensions in the module are not explicitly supported,
  // return unmodified.
  if (!AllExtensionsSupported()) return Status::SuccessWithoutChange;

  // Eliminate Dead functions.
  bool modified = EliminateDeadFunctions();

  InitializeModuleScopeLiveInstructions();

  // Run |AggressiveDCE| on the remaining functions.  The order does not matter,
  // since |AggressiveDCE| is intra-procedural.  This can mean that function
  // will become dead if all function call to them are removed.  These dead
  // function will still be in the module after this pass.  We expect this to be
  // rare.
  for (Function& fp : *context()->module()) {
    modified |= AggressiveDCE(&fp);
  }

  // If the decoration manager is kept live then the context will try to keep it
  // up to date.  ADCE deals with group decorations by changing the operands in
  // |OpGroupDecorate| instruction directly without informing the decoration
  // manager.  This can put it in an invalid state which will cause an error
  // when the context tries to update it.  To avoid this problem invalidate
  // the decoration manager upfront.
  //
  // We kill it at now because it is used when processing the entry point
  // functions.
  context()->InvalidateAnalyses(IRContext::Analysis::kAnalysisDecorations);

  // Process module-level instructions. Now that all live instructions have
  // been marked, it is safe to remove dead global values.
  modified |= ProcessGlobalValues();

  assert((to_kill_.empty() || modified) &&
         "A dead instruction was identified, but no change recorded.");

  // Kill all dead instructions.
  for (auto inst : to_kill_) {
    context()->KillInst(inst);
  }

  // Cleanup all CFG including all unreachable blocks.
  for (Function& fp : *context()->module()) {
    modified |= CFGCleanup(&fp);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}